

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O3

int64 Time::microTicks(void)

{
  timespec ts;
  timespec local_18;
  
  clock_gettime(1,&local_18);
  return local_18.tv_nsec / 1000 + local_18.tv_sec * 1000000;
}

Assistant:

int64 Time::microTicks()
{
#ifdef _WIN32
  LARGE_INTEGER li;
  VERIFY(QueryPerformanceCounter(&li));
  return li.QuadPart / Private::perfFreq;
#else
  struct timespec ts;
  clock_gettime(CLOCK_MONOTONIC, &ts);
  return (int64)ts.tv_sec * 1000000 + ts.tv_nsec / 1000;
#endif
}